

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.h
# Opt level: O0

void __thiscall Application::Application(Application *this)

{
  allocator local_11;
  Application *local_10;
  Application *this_local;
  
  this->screenScale = 1.0;
  this->vsyncEnabled = true;
  this->_window = (GLFWwindow *)0x0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->_windowName,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->_windowWidth = 0;
  this->_windowHeight = 0;
  std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
  vector(&this->_inputHandlers);
  return;
}

Assistant:

Application() {}